

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int LoadEXRImageFromMemory
              (EXRImage *exr_image,EXRHeader *exr_header,uchar *memory,size_t size,char **err)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  int unaff_EBP;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  size_t sVar12;
  ulong *puVar13;
  uint uVar14;
  bool bVar15;
  OffsetData offset_data;
  size_type __dnew;
  vector<int,_std::allocator<int>_> num_y_tiles;
  vector<int,_std::allocator<int>_> num_x_tiles;
  undefined1 in_stack_ffffffffffffff08;
  undefined1 local_e8 [24];
  undefined8 uStack_d0;
  ulong *local_c0;
  undefined1 local_b8 [32];
  ulong local_98;
  ulong *local_90;
  size_t local_88;
  pointer local_80;
  long local_78;
  ulong *local_70;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> local_48;
  
  if ((memory == (uchar *)0x0 || exr_image == (EXRImage *)0x0) || size < 8) {
    pcVar10 = "Invalid argument for LoadEXRImageFromMemory";
    pcVar8 = "";
  }
  else {
    if ((ulong)exr_header->header_len != 0) {
      local_90 = (ulong *)(memory + (ulong)exr_header->header_len + 8);
      if (exr_header == (EXRHeader *)0x0 || size < 9) {
        local_b8._0_8_ = (pointer)0x26;
        local_e8._0_8_ = (pointer)(local_e8 + 0x10);
        local_e8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_e8,(ulong)local_b8);
        local_e8._16_8_ = local_b8._0_8_;
        (((pointer)local_e8._0_8_)->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x2064696c61766e49;
        (((pointer)local_e8._0_8_)->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x746e656d75677261;
        (((pointer)local_e8._0_8_)->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x63654420726f6620;
        (((pointer)(local_e8._0_8_ + 0x18))->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x6d4952584565646f;
        builtin_strncpy((char *)((long)&(((pointer)(local_e8._0_8_ + 0x18))->
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 6),"Image().",8
                       );
        local_e8._8_8_ = local_b8._0_8_;
        *(char *)(local_b8._0_8_ +
                 (long)&((pointer)local_e8._0_8_)->
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ) = '\0';
        if (err != (char **)0x0) {
          pcVar8 = strdup((char *)local_e8._0_8_);
          *err = pcVar8;
        }
        if ((pointer)local_e8._0_8_ == (pointer)(local_e8 + 0x10)) {
          return -3;
        }
        goto LAB_0020cfb2;
      }
      iVar4 = exr_header->compression_type;
      uVar11 = 0x10;
      if ((iVar4 != 3) && (iVar4 != 0x80)) {
        if (iVar4 == 4) {
          uVar11 = 0x20;
        }
        else {
          uVar11 = 1;
        }
      }
      iVar4 = (exr_header->data_window).max_x;
      iVar1 = (exr_header->data_window).min_x;
      iVar6 = iVar4 - iVar1;
      if ((iVar4 < iVar1) || (iVar6 == 0x7fffffff)) {
        local_e8._0_8_ = local_e8 + 0x10;
        local_b8._0_8_ = (pointer)0x18;
        local_e8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_e8,(ulong)local_b8);
        (((pointer)local_e8._0_8_)->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x2064696c61766e49;
        (((pointer)local_e8._0_8_)->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6469772061746164;
        (((pointer)local_e8._0_8_)->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x65756c6176206874;
      }
      else {
        iVar4 = (exr_header->data_window).max_y;
        iVar1 = (exr_header->data_window).min_y;
        iVar3 = iVar4 - iVar1;
        if ((iVar1 <= iVar4) && (iVar3 != 0x7fffffff)) {
          if (iVar6 < 0x800000) {
            if (iVar3 < 0x800000) {
              if (exr_header->tiled == 0) {
                local_e8._16_8_ = (pointer)0x0;
                uStack_d0._0_4_ = 0;
                uStack_d0._4_4_ = 0;
                local_e8._0_8_ = (pointer)0x0;
                local_e8._8_8_ = (pointer)0x0;
                local_88 = (size_t)exr_header->chunk_count;
                if ((long)local_88 < 1) {
                  uVar5 = (ulong)(long)(iVar3 + 1) / uVar11;
                  local_88 = uVar5 + (uVar11 * uVar5 < (ulong)(long)(iVar3 + 1));
                  tinyexr::InitSingleResolutionOffsets((OffsetData *)local_e8,local_88);
                }
                else {
                  tinyexr::InitSingleResolutionOffsets((OffsetData *)local_e8,local_88);
                }
LAB_0020d30c:
                if (exr_header->tiled == 0) {
                  local_80 = (((_Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                *)local_e8._0_8_)->_M_impl).super__Vector_impl_data._M_start;
                  bVar2 = local_88 != 0;
                  puVar13 = local_90;
                  sVar12 = local_88;
                  if (bVar2) {
                    local_70 = (ulong *)(memory + size);
                    local_78 = -local_88;
                    bVar2 = true;
                    uVar11 = 1;
                    do {
                      if (puVar13 + 1 < local_70) {
                        if (size <= *puVar13) {
                          local_b8._0_8_ = local_b8 + 0x10;
                          local_c0 = puVar13;
                          local_98 = uVar11;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_b8,"Invalid offset value in DecodeEXRImage.",""
                                    );
                          goto LAB_0020d3e6;
                        }
                        *(ulong *)(*(long *)&(local_80->
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             )._M_impl.super__Vector_impl_data + -8 + uVar11 * 8) =
                             *puVar13;
                        bVar15 = true;
                        puVar13 = puVar13 + 1;
                        uVar5 = uVar11;
                      }
                      else {
                        local_b8._0_8_ = local_b8 + 0x10;
                        local_c0 = puVar13;
                        local_98 = uVar11;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_b8,"Insufficient data size in offset table.","");
LAB_0020d3e6:
                        if (err != (char **)0x0) {
                          pcVar8 = strdup((char *)local_b8._0_8_);
                          *err = pcVar8;
                        }
                        if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
                          operator_delete((void *)local_b8._0_8_);
                        }
                        unaff_EBP = -4;
                        bVar15 = false;
                        puVar13 = local_c0;
                        uVar5 = local_98;
                        sVar12 = local_88;
                      }
                      if (!bVar15) break;
                      bVar2 = uVar5 < sVar12;
                      uVar11 = uVar5 + 1;
                    } while (uVar5 + local_78 != 0);
                  }
                  local_90 = puVar13;
                  if (bVar2) {
                    uVar9 = 0;
                  }
                  else {
                    uVar9 = 1;
                    if (sVar12 != 0) {
                      lVar7 = 0;
                      do {
                        if (*(long *)(*(long *)&(local_80->
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                )._M_impl.super__Vector_impl_data + lVar7 * 8) == 0)
                        {
                          uVar11 = 1;
                          uVar9 = 0;
                          goto LAB_0020d50d;
                        }
                        lVar7 = lVar7 + 1;
                      } while (sVar12 != lVar7);
                    }
                  }
                  goto LAB_0020d5b2;
                }
                goto LAB_0020d5b8;
              }
              if (exr_header->tile_size_x < 0x800001) {
                if (exr_header->tile_size_y < 0x800001) {
                  local_e8._16_8_ = (pointer)0x0;
                  uStack_d0._0_4_ = 0;
                  uStack_d0._4_4_ = 0;
                  local_e8._0_8_ = (pointer)0x0;
                  local_e8._8_8_ = (pointer)0x0;
                  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  tinyexr::PrecalculateTileInfo(&local_48,&local_68,exr_header);
                  iVar4 = tinyexr::InitTileOffsets
                                    ((OffsetData *)local_e8,exr_header,&local_48,&local_68);
                  if (exr_header->chunk_count != iVar4 && 0 < exr_header->chunk_count) {
                    local_b8._0_8_ = (pointer)(local_b8 + 0x10);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_b8,"Invalid offset table size.","");
                    if (err != (char **)0x0) {
                      pcVar8 = strdup((char *)local_b8._0_8_);
                      *err = pcVar8;
                    }
                    if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
                      operator_delete((void *)local_b8._0_8_);
                    }
                    if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start);
                    }
                    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start);
                    }
                    unaff_EBP = -4;
                    goto LAB_0020d623;
                  }
                  local_c0 = (ulong *)CONCAT44(local_c0._4_4_,iVar4);
                  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
                  }
                  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
                  }
                  unaff_EBP = tinyexr::ReadOffsets
                                        ((OffsetData *)local_e8,memory,(uchar **)&local_90,size,err)
                  ;
                  iVar4 = unaff_EBP;
                  if (unaff_EBP == 0) {
                    local_98 = local_98 & 0xffffffff00000000;
                    bVar2 = tinyexr::IsAnyOffsetsAreInvalid((OffsetData *)local_e8);
                    unaff_EBP = -4;
                    if (bVar2) {
                      tinyexr::ReconstructTileOffsets
                                ((OffsetData *)local_e8,exr_header,memory,(uchar *)local_90,
                                 (ulong)(exr_header->multipart != 0),exr_header->non_image != 0,
                                 (bool)in_stack_ffffffffffffff08);
                    }
                    iVar4 = (int)local_98;
                  }
                  if (iVar4 != 0) goto LAB_0020d623;
                  local_88 = (size_t)(int)(uint)local_c0;
                  goto LAB_0020d30c;
                }
                pcVar10 = "tile height too large.";
                pcVar8 = "";
              }
              else {
                pcVar10 = "tile width too large.";
                pcVar8 = "";
              }
            }
            else {
              pcVar10 = "data height too large.";
              pcVar8 = "";
            }
          }
          else {
            pcVar10 = "data width too large.";
            pcVar8 = "";
          }
          local_e8._0_8_ = (pointer)(local_e8 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,pcVar10,pcVar8);
          if (err != (char **)0x0) {
            pcVar8 = strdup((char *)local_e8._0_8_);
            *err = pcVar8;
          }
          if ((pointer)local_e8._0_8_ == (pointer)(local_e8 + 0x10)) {
            return -4;
          }
          goto LAB_0020d080;
        }
        local_e8._0_8_ = local_e8 + 0x10;
        local_b8._0_8_ = (pointer)0x19;
        local_e8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_e8,(ulong)local_b8);
        builtin_strncpy((char *)((long)&(((pointer)local_e8._0_8_)->
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish + 1),"ata heig",
                        8);
        builtin_strncpy((char *)((long)&(((pointer)local_e8._0_8_)->
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_end_of_storage + 1),
                        "ht value",8);
        (((pointer)local_e8._0_8_)->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x2064696c61766e49;
        (((pointer)local_e8._0_8_)->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6965682061746164;
      }
      local_e8._8_8_ = local_b8._0_8_;
      *(char *)(local_b8._0_8_ +
               (long)(_Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)local_e8._0_8_) = '\0';
      local_e8._16_8_ = local_b8._0_8_;
      if (err != (char **)0x0) {
        pcVar8 = strdup((char *)local_e8._0_8_);
        *err = pcVar8;
      }
      if ((pointer)local_e8._0_8_ == (pointer)(local_e8 + 0x10)) {
        return -4;
      }
LAB_0020d080:
      operator_delete((void *)local_e8._0_8_);
      return -4;
    }
    pcVar10 = "EXRHeader variable is not initialized.";
    pcVar8 = "";
  }
  local_e8._0_8_ = (pointer)(local_e8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,pcVar10,pcVar8);
  if (err != (char **)0x0) {
    pcVar8 = strdup((char *)local_e8._0_8_);
    *err = pcVar8;
  }
  if ((pointer)local_e8._0_8_ == (pointer)(local_e8 + 0x10)) {
    return -3;
  }
LAB_0020cfb2:
  operator_delete((void *)local_e8._0_8_);
  return -3;
  while( true ) {
    bVar2 = sVar12 <= uVar11;
    uVar14 = (uint)bVar2;
    bVar15 = uVar11 == sVar12;
    uVar11 = uVar11 + 1;
    uVar9 = (uint)bVar2;
    if (bVar15) break;
LAB_0020d50d:
    uVar14 = uVar9;
    if (((long)puVar13 - (long)memory) + 8U < size) {
      uVar9 = *(uint *)((long)puVar13 + 4);
      bVar2 = uVar9 < size;
      if (bVar2) {
        *(long *)(*(long *)&(local_80->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data + -8 + uVar11 * 8) =
             (long)puVar13 - (long)memory;
        puVar13 = (ulong *)((long)puVar13 + (ulong)(uVar9 + 8));
        bVar2 = true;
      }
    }
    else {
      bVar2 = false;
    }
    if (!bVar2) break;
  }
  local_c0 = (ulong *)CONCAT44(local_c0._4_4_,uVar14);
  if (uVar14 == 0) {
    local_b8._0_8_ = (pointer)(local_b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"Cannot reconstruct lineOffset table in DecodeEXRImage.","");
    if (err != (char **)0x0) {
      pcVar8 = strdup((char *)local_b8._0_8_);
      *err = pcVar8;
    }
    if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
    unaff_EBP = -4;
  }
  uVar9 = (uint)local_c0;
LAB_0020d5b2:
  if ((uVar9 & 1) == 0) goto LAB_0020d623;
LAB_0020d5b8:
  local_b8._0_8_ = local_b8 + 0x10;
  local_b8._8_8_ = 0;
  local_b8[0x10] = '\0';
  unaff_EBP = tinyexr::DecodeChunk
                        (exr_image,exr_header,(OffsetData *)local_e8,memory,size,(string *)local_b8)
  ;
  if (unaff_EBP != 0) {
    if ((err != (char **)0x0) && (local_b8._8_8_ != 0)) {
      pcVar8 = strdup((char *)local_b8._0_8_);
      *err = pcVar8;
    }
    FreeEXRImage(exr_image);
  }
  if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_);
  }
LAB_0020d623:
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             *)local_e8);
  return unaff_EBP;
}

Assistant:

int LoadEXRImageFromMemory(EXRImage *exr_image, const EXRHeader *exr_header,
                           const unsigned char *memory, const size_t size,
                           const char **err) {
  if (exr_image == NULL || memory == NULL ||
      (size < tinyexr::kEXRVersionSize)) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXRImageFromMemory",
                             err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (exr_header->header_len == 0) {
    tinyexr::SetErrorMessage("EXRHeader variable is not initialized.", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  const unsigned char *head = memory;
  const unsigned char *marker = reinterpret_cast<const unsigned char *>(
      memory + exr_header->header_len +
      8);  // +8 for magic number + version header.
  return tinyexr::DecodeEXRImage(exr_image, exr_header, head, marker, size,
                                 err);
}